

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::CreateSubsectorLinks(FPolyObj *this)

{
  side_t *this_00;
  subsector_t *psVar1;
  uint uVar2;
  TArray<FPolySeg,_FPolySeg> *this_01;
  FPolySeg *this_02;
  side_t **ppsVar3;
  vertex_t *pvVar4;
  subsector_t *sub;
  side_t *side;
  FPolySeg *seg;
  float local_28;
  uint i;
  float dummybbox [4];
  FPolyNode *node;
  FPolyObj *this_local;
  
  dummybbox._8_8_ = NewPolyNode();
  memset(&local_28,0,0x10);
  *(FPolyObj **)dummybbox._8_8_ = this;
  this_01 = (TArray<FPolySeg,_FPolySeg> *)(dummybbox._8_8_ + 0x28);
  uVar2 = TArray<side_t_*,_side_t_*>::Size(&this->Sidedefs);
  TArray<FPolySeg,_FPolySeg>::Resize(this_01,uVar2);
  seg._4_4_ = 0;
  while( true ) {
    uVar2 = TArray<side_t_*,_side_t_*>::Size(&this->Sidedefs);
    if (uVar2 <= seg._4_4_) break;
    this_02 = TArray<FPolySeg,_FPolySeg>::operator[]
                        ((TArray<FPolySeg,_FPolySeg> *)(dummybbox._8_8_ + 0x28),(ulong)seg._4_4_);
    ppsVar3 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)seg._4_4_);
    this_00 = *ppsVar3;
    pvVar4 = side_t::V1(this_00);
    FPolyVertex::operator=(&this_02->v1,pvVar4);
    pvVar4 = side_t::V2(this_00);
    FPolyVertex::operator=(&this_02->v2,pvVar4);
    this_02->wall = this_00;
    seg._4_4_ = seg._4_4_ + 1;
  }
  if ((i_compatflags & 0x40000000U) == 0) {
    SplitPoly((FPolyNode *)dummybbox._8_8_,nodes + (long)numnodes + -1,&local_28);
  }
  else {
    psVar1 = this->CenterSubsector;
    *(FPolyNode **)(dummybbox._8_8_ + 8) = psVar1->polys;
    if (*(long *)(dummybbox._8_8_ + 8) != 0) {
      if (*(int *)(*(long *)(dummybbox._8_8_ + 8) + 0x38) != 0x539) {
        __assert_fail("node->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x869,"void FPolyObj::CreateSubsectorLinks()");
      }
      *(undefined8 *)(*(long *)(dummybbox._8_8_ + 8) + 0x10) = dummybbox._8_8_;
    }
    *(undefined8 *)(dummybbox._8_8_ + 0x10) = 0;
    psVar1->polys = (FPolyNode *)dummybbox._8_8_;
    *(undefined8 *)(dummybbox._8_8_ + 0x20) = *(undefined8 *)(*(long *)dummybbox._8_8_ + 0xd8);
    *(undefined8 *)(*(long *)dummybbox._8_8_ + 0xd8) = dummybbox._8_8_;
    *(subsector_t **)(dummybbox._8_8_ + 0x18) = psVar1;
  }
  return;
}

Assistant:

void FPolyObj::CreateSubsectorLinks()
{
	FPolyNode *node = NewPolyNode();
	// Even though we don't care about it, we need to initialize this
	// bounding box to something so that Valgrind won't complain about it
	// when SplitPoly modifies it.
	float dummybbox[4] = { 0 };

	node->poly = this;
	node->segs.Resize(Sidedefs.Size());

	for(unsigned i=0; i<Sidedefs.Size(); i++)
	{
		FPolySeg *seg = &node->segs[i];
		side_t *side = Sidedefs[i];

		seg->v1 = side->V1();
		seg->v2 = side->V2();
		seg->wall = side;
	}
	if (!(i_compatflags & COMPATF_POLYOBJ))
	{
		SplitPoly(node, nodes + numnodes - 1, dummybbox);
	}
	else
	{
		subsector_t *sub = CenterSubsector;

		// Link node to subsector
		node->pnext = sub->polys;
		if (node->pnext != NULL) 
		{
			assert(node->pnext->state == 1337);
			node->pnext->pprev = node;
		}
		node->pprev = NULL;
		sub->polys = node;

		// link node to polyobject
		node->snext = node->poly->subsectorlinks;
		node->poly->subsectorlinks = node;
		node->subsector = sub;
	}
}